

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_up_all
          (Omega_h *this,Mesh *mesh,Int low_dim,Int high_dim,Read<signed_char> *low_marked)

{
  Omega_h_Family OVar1;
  LO size_in;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  Int local_19c;
  Int local_198;
  Int local_194;
  Int local_190;
  Int local_18c;
  Int local_188;
  Int local_184;
  Int local_180;
  Int local_17c;
  Int local_178;
  Int local_174;
  Int local_170;
  Int local_16c;
  Int local_168;
  Int local_164;
  Int local_160;
  Int local_15c;
  Int local_158;
  Int local_154;
  Int local_150;
  Int local_14c;
  Write<signed_char> local_128;
  undefined1 local_118 [8];
  type f;
  string local_d8 [32];
  undefined1 local_b8 [8];
  Write<signed_char> out;
  undefined1 local_a0 [4];
  LO nh;
  LOs hl2l;
  undefined1 local_78 [4];
  Int deg;
  Adj l2h;
  Read<signed_char> *low_marked_local;
  Int high_dim_local;
  Int low_dim_local;
  Mesh *mesh_local;
  
  l2h.codes.write_.shared_alloc_.direct_ptr = low_marked;
  Mesh::ask_down((Adj *)local_78,mesh,high_dim,low_dim);
  OVar1 = Mesh::family(mesh);
  if (OVar1 == OMEGA_H_SIMPLEX) {
    if (high_dim == 0) {
      local_14c = 1;
    }
    else {
      if (high_dim == 1) {
        if (low_dim == 0) {
          local_150 = 2;
        }
        else {
          local_150 = -1;
          if (low_dim == 1) {
            local_150 = 1;
          }
        }
        local_154 = local_150;
      }
      else {
        if (high_dim == 2) {
          if (low_dim == 0) {
            local_158 = 3;
          }
          else {
            if (low_dim == 1) {
              local_15c = 3;
            }
            else {
              local_15c = -1;
              if (low_dim == 2) {
                local_15c = 1;
              }
            }
            local_158 = local_15c;
          }
          local_160 = local_158;
        }
        else {
          if (high_dim == 3) {
            if (low_dim == 0) {
              local_164 = 4;
            }
            else {
              if (low_dim == 1) {
                local_168 = 6;
              }
              else {
                if (low_dim == 2) {
                  local_16c = 4;
                }
                else {
                  local_16c = -1;
                  if (low_dim == 3) {
                    local_16c = 1;
                  }
                }
                local_168 = local_16c;
              }
              local_164 = local_168;
            }
            local_170 = local_164;
          }
          else {
            local_170 = -1;
          }
          local_160 = local_170;
        }
        local_154 = local_160;
      }
      local_14c = local_154;
    }
    local_174 = local_14c;
  }
  else {
    if (high_dim == 0) {
      local_178 = -1;
      if (low_dim == 0) {
        local_178 = 1;
      }
    }
    else {
      if (high_dim == 1) {
        if (low_dim == 0) {
          local_17c = 2;
        }
        else {
          local_17c = -1;
          if (low_dim == 1) {
            local_17c = 1;
          }
        }
        local_180 = local_17c;
      }
      else {
        if (high_dim == 2) {
          if (low_dim == 0) {
            local_184 = 4;
          }
          else {
            if (low_dim == 1) {
              local_188 = 4;
            }
            else {
              local_188 = -1;
              if (low_dim == 2) {
                local_188 = 1;
              }
            }
            local_184 = local_188;
          }
          local_18c = local_184;
        }
        else {
          if (high_dim == 3) {
            if (low_dim == 0) {
              local_190 = 8;
            }
            else {
              if (low_dim == 1) {
                local_194 = 0xc;
              }
              else {
                if (low_dim == 2) {
                  local_198 = 6;
                }
                else {
                  local_198 = -1;
                  if (low_dim == 3) {
                    local_198 = 1;
                  }
                }
                local_194 = local_198;
              }
              local_190 = local_194;
            }
            local_19c = local_190;
          }
          else {
            local_19c = -1;
          }
          local_18c = local_19c;
        }
        local_180 = local_18c;
      }
      local_178 = local_180;
    }
    local_174 = local_178;
  }
  Read<int>::Read((Read<int> *)local_a0,
                  (Read<int> *)&l2h.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  size_in = Mesh::nents(mesh,high_dim);
  out.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"",(allocator *)((long)&f.out.shared_alloc_.direct_ptr + 7))
  ;
  Write<signed_char>::Write((Write<signed_char> *)local_b8,size_in,'\0',(string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.out.shared_alloc_.direct_ptr + 7));
  local_118._0_4_ = local_174;
  Read<int>::Read((Read<int> *)&f,(Read<int> *)local_a0);
  Read<signed_char>::Read((Read<signed_char> *)&f.hl2l.write_.shared_alloc_.direct_ptr,low_marked);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.low_marked.write_.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_b8);
  parallel_for<Omega_h::mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::__0>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_118,"mark_up_all");
  Write<signed_char>::Write(&local_128,(Write<signed_char> *)local_b8);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_128);
  Write<signed_char>::~Write(&local_128);
  mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_118);
  Write<signed_char>::~Write((Write<signed_char> *)local_b8);
  Read<int>::~Read((Read<int> *)local_a0);
  Adj::~Adj((Adj *)local_78);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_up_all(
    Mesh* mesh, Int low_dim, Int high_dim, Read<I8> low_marked) {
  auto l2h = mesh->ask_down(high_dim, low_dim);
  auto deg = element_degree(mesh->family(), high_dim, low_dim);
  auto hl2l = l2h.ab2b;
  auto nh = mesh->nents(high_dim);
  Write<I8> out(nh, 0);
  auto f = OMEGA_H_LAMBDA(LO h) {
    bool all_marked = true;
    for (Int hhl = 0; hhl < deg; ++hhl) {
      auto l = hl2l[h * deg + hhl];
      if (!low_marked[l]) all_marked = false;
    }
    out[h] = I8(all_marked);
  };
  parallel_for(nh, f, "mark_up_all");
  return out;
}